

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O2

void cfl_luma_subsampling_444_hbd_avx2
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  pauVar1 = (undefined1 (*) [32])(pred_buf_q3 + (ulong)(uint)(width * 2) * 0x10);
  pauVar2 = (undefined1 (*) [32])(input + 0x10);
  do {
    auVar4 = *pauVar2;
    auVar3 = vpsllw_avx2(pauVar2[-1],3);
    *(undefined1 (*) [32])pred_buf_q3 = auVar3;
    auVar4 = vpsllw_avx2(auVar4,3);
    *(undefined1 (*) [32])((long)pred_buf_q3 + 0x20) = auVar4;
    pred_buf_q3 = (uint16_t *)((long)pred_buf_q3 + 0x40);
    pauVar2 = (undefined1 (*) [32])(*pauVar2 + (long)input_stride * 2);
  } while (pred_buf_q3 < pauVar1);
  return;
}

Assistant:

static void cfl_luma_subsampling_444_hbd_avx2(const uint16_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;  // Forever 32
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    __m256i top_1 = _mm256_loadu_si256((__m256i *)(input + 16));
    _mm256_storeu_si256(row, _mm256_slli_epi16(top, 3));
    _mm256_storeu_si256(row + 1, _mm256_slli_epi16(top_1, 3));
    input += input_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}